

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_config_free(event_config *cfg)

{
  event_config_entry *entry_00;
  event_config_entry *entry;
  event_config *cfg_local;
  
  while (entry_00 = (cfg->entries).tqh_first, entry_00 != (event_config_entry *)0x0) {
    if ((entry_00->next).tqe_next == (event_config_entry *)0x0) {
      (cfg->entries).tqh_last = (entry_00->next).tqe_prev;
    }
    else {
      (((entry_00->next).tqe_next)->next).tqe_prev = (entry_00->next).tqe_prev;
    }
    *(entry_00->next).tqe_prev = (entry_00->next).tqe_next;
    event_config_entry_free(entry_00);
  }
  event_mm_free_(cfg);
  return;
}

Assistant:

void
event_config_free(struct event_config *cfg)
{
	struct event_config_entry *entry;

	while ((entry = TAILQ_FIRST(&cfg->entries)) != NULL) {
		TAILQ_REMOVE(&cfg->entries, entry, next);
		event_config_entry_free(entry);
	}
	mm_free(cfg);
}